

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  key_type *__k;
  string *element_name;
  CppType CVar1;
  Type TVar2;
  iterator iVar3;
  EnumDescriptor *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    __k = *(key_type **)(*(long *)(field + 0x58) + 8);
    GoogleOnceInit(&(anonymous_namespace)::allowed_proto3_extendees_init_,
                   anon_unknown_1::InitAllowedProto3Extendee);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_,__k);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_->_M_impl).
         super__Rb_tree_header) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  if (*(int *)(field + 0x4c) == 2) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
             "Required fields are not allowed in proto3.");
  }
  if (field[0x98] == (FieldDescriptor)0x1) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
             "Explicit default values are not allowed in proto3.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 == CPPTYPE_ENUM) {
    pEVar4 = FieldDescriptor::enum_type(field);
    if (pEVar4 != (EnumDescriptor *)0x0) {
      pEVar4 = FieldDescriptor::enum_type(field);
      if (*(int *)(*(long *)(pEVar4 + 0x10) + 0x8c) != 3) {
        element_name = *(string **)(field + 8);
        pEVar4 = FieldDescriptor::enum_type(field);
        std::operator+(&local_48,"Enum type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pEVar4 + 8));
        std::operator+(&bStack_a8,&local_48,"\" is not a proto3 enum, but is used in \"");
        std::operator+(&local_88,&bStack_a8,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(field + 0x58) + 8));
        std::operator+(&local_68,&local_88,"\" which is a proto3 message type.");
        AddError(this,element_name,&proto->super_Message,TYPE,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&bStack_a8);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
  }
  TVar2 = FieldDescriptor::type(field);
  if (TVar2 == TYPE_GROUP) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
        "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
             "\" is not a proto3 enum, but is used in \"" +
             field->containing_type()->full_name() +
             "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}